

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synth_core.cpp
# Opt level: O2

int __thiscall V2Osc::init(V2Osc *this,EVP_PKEY_CTX *ctx)

{
  uint32_t uVar1;
  int in_EDX;
  
  if (in_EDX < 3) {
    this->cnt = 0;
    (this->nf).l = 0.0;
    (this->nf).b = 0.0;
    uVar1 = init::seeds[in_EDX];
    this->nseed = uVar1;
    this->inst = (V2Instance *)ctx;
    return uVar1;
  }
  __assert_fail("idx < COUNTOF(seeds)",
                "/workspace/llm4binary/github/license_c_cmakelists/jgilje[P]v2m-player/src/synth_core.cpp"
                ,0x200,"void V2Osc::init(V2Instance *, int)");
}

Assistant:

void init(V2Instance *instance, int idx)
    {
        static const uint32_t seeds[] = { 0xdeadbeefu, 0xbaadf00du, 0xd3adc0deu };
        assert(idx < COUNTOF(seeds));

        cnt = 0;
        nf.init();
        nseed = seeds[idx];
        inst = instance;
    }